

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

void BasePort::AddHardwareVersion(unsigned_long hver)

{
  bool bVar1;
  unsigned_long in_RDI;
  value_type_conflict2 local_8;
  
  if (in_RDI != 0) {
    bVar1 = HardwareVersionValid(in_RDI);
    if (!bVar1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&SupportedHardware,&local_8);
    }
  }
  return;
}

Assistant:

void BasePort::AddHardwareVersion(unsigned long hver)
{
    // Add if non-zero and not already on list
    if (hver && !HardwareVersionValid(hver))
        SupportedHardware.push_back(hver);
}